

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildInfo.cpp
# Opt level: O2

string * jbcoin::BuildInfo::getVersionString_abi_cxx11_(void)

{
  bool bVar1;
  int iVar2;
  SemanticVersion v;
  string local_70;
  SemanticVersion local_50;
  
  if ((getVersionString[abi:cxx11]()::value_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getVersionString[abi:cxx11]()::value_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&getVersionString[abi:cxx11]()::value_abi_cxx11_,"0.80.0+DEBUG",
               (allocator *)&local_50);
    local_50.majorVersion = 0;
    local_50.minorVersion = 0;
    local_50.patchVersion = 0;
    local_50.preReleaseIdentifiers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.preReleaseIdentifiers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.preReleaseIdentifiers.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50.metaData.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.metaData.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.metaData.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = beast::SemanticVersion::parse
                      (&local_50,&getVersionString[abi:cxx11]()::value_abi_cxx11_);
    if (bVar1) {
      beast::SemanticVersion::print_abi_cxx11_(&local_70,&local_50);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_70,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &getVersionString[abi:cxx11]()::value_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_70);
      if (!bVar1) {
        beast::SemanticVersion::~SemanticVersion(&local_50);
        __cxa_atexit(std::__cxx11::string::~string,&getVersionString[abi:cxx11]()::value_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&getVersionString[abi:cxx11]()::value_abi_cxx11_);
        return &getVersionString[abi:cxx11]()::value_abi_cxx11_;
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &getVersionString[abi:cxx11]()::value_abi_cxx11_,": Bad server version string");
    LogicError(&local_70);
  }
  return &getVersionString[abi:cxx11]()::value_abi_cxx11_;
}

Assistant:

std::string const&
getVersionString ()
{
    static std::string const value = [] {
        std::string const s = versionString;
        beast::SemanticVersion v;
        if (!v.parse (s) || v.print () != s)
            LogicError (s + ": Bad server version string");
        return s;
    }();
    return value;
}